

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.h
# Opt level: O0

void llvm::yaml::ScalarEnumerationTraits<llvm::dwarf::Tag,_void>::enumeration(IO *io,Tag *value)

{
  Tag *value_local;
  IO *io_local;
  
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_null",DW_TAG_null);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_array_type",DW_TAG_array_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_class_type",DW_TAG_class_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_entry_point",DW_TAG_entry_point);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_enumeration_type",DW_TAG_enumeration_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_formal_parameter",DW_TAG_formal_parameter);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_imported_declaration",DW_TAG_imported_declaration)
  ;
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_label",DW_TAG_label);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_lexical_block",DW_TAG_lexical_block);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_member",DW_TAG_member);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_pointer_type",DW_TAG_pointer_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_reference_type",DW_TAG_reference_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_compile_unit",DW_TAG_compile_unit);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_string_type",DW_TAG_string_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_structure_type",DW_TAG_structure_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_subroutine_type",DW_TAG_subroutine_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_typedef",DW_TAG_typedef);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_union_type",DW_TAG_union_type);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_unspecified_parameters",DW_TAG_unspecified_parameters);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_variant",DW_TAG_variant);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_common_block",DW_TAG_common_block);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_common_inclusion",DW_TAG_common_inclusion);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_inheritance",DW_TAG_inheritance);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_inlined_subroutine",DW_TAG_inlined_subroutine);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_module",DW_TAG_module);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_ptr_to_member_type",DW_TAG_ptr_to_member_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_set_type",DW_TAG_set_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_subrange_type",DW_TAG_subrange_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_with_stmt",DW_TAG_with_stmt);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_access_declaration",DW_TAG_access_declaration);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_base_type",DW_TAG_base_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_catch_block",DW_TAG_catch_block);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_const_type",DW_TAG_const_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_constant",DW_TAG_constant);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_enumerator",DW_TAG_enumerator);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_file_type",DW_TAG_file_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_friend",DW_TAG_friend);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_namelist",DW_TAG_namelist);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_namelist_item",DW_TAG_namelist_item);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_packed_type",DW_TAG_packed_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_subprogram",DW_TAG_subprogram);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_template_type_parameter",DW_TAG_template_type_parameter);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_template_value_parameter",DW_TAG_template_value_parameter);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_thrown_type",DW_TAG_thrown_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_try_block",DW_TAG_try_block);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_variant_part",DW_TAG_variant_part);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_variable",DW_TAG_variable);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_volatile_type",DW_TAG_volatile_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_dwarf_procedure",DW_TAG_dwarf_procedure);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_restrict_type",DW_TAG_restrict_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_interface_type",DW_TAG_interface_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_namespace",DW_TAG_namespace);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_imported_module",DW_TAG_imported_module);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_unspecified_type",DW_TAG_unspecified_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_partial_unit",DW_TAG_partial_unit);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_imported_unit",DW_TAG_imported_unit);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_condition",DW_TAG_condition);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_shared_type",DW_TAG_shared_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_type_unit",DW_TAG_type_unit);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_rvalue_reference_type",DW_TAG_rvalue_reference_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_template_alias",DW_TAG_template_alias);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_coarray_type",DW_TAG_coarray_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_generic_subrange",DW_TAG_generic_subrange);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_dynamic_type",DW_TAG_dynamic_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_atomic_type",DW_TAG_atomic_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_call_site",DW_TAG_call_site);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_call_site_parameter",DW_TAG_call_site_parameter);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_skeleton_unit",DW_TAG_skeleton_unit);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_immutable_type",DW_TAG_immutable_type);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_MIPS_loop",DW_TAG_MIPS_loop);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_format_label",DW_TAG_format_label);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_function_template",DW_TAG_function_template);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_class_template",DW_TAG_class_template);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_GNU_template_template_param",DW_TAG_GNU_template_template_param);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_GNU_template_parameter_pack",DW_TAG_GNU_template_parameter_pack);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_GNU_formal_parameter_pack",DW_TAG_GNU_formal_parameter_pack);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_GNU_call_site",DW_TAG_GNU_call_site);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_GNU_call_site_parameter",DW_TAG_GNU_call_site_parameter);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_APPLE_property",DW_TAG_APPLE_property);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_BORLAND_property",DW_TAG_BORLAND_property);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_BORLAND_Delphi_string",DW_TAG_BORLAND_Delphi_string);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_BORLAND_Delphi_dynamic_array",DW_TAG_BORLAND_Delphi_dynamic_array);
  IO::enumCase<llvm::dwarf::Tag>(io,value,"DW_TAG_BORLAND_Delphi_set",DW_TAG_BORLAND_Delphi_set);
  IO::enumCase<llvm::dwarf::Tag>
            (io,value,"DW_TAG_BORLAND_Delphi_variant",DW_TAG_BORLAND_Delphi_variant);
  IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::Tag>(io,value);
  return;
}

Assistant:

static void enumeration(IO &io, dwarf::Tag &value) {
#include "llvm/BinaryFormat/Dwarf.def"
    io.enumFallback<Hex16>(value);
  }